

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyFreeTags(TidyDocImpl *doc)

{
  TidyTagImpl *tags_00;
  TidyTagImpl *tags;
  TidyDocImpl *doc_local;
  
  tags_00 = &doc->tags;
  tagsEmptyHash(doc,tags_00);
  prvTidyFreeDeclaredTags(doc,tagtype_null);
  FreeDict(doc,tags_00->xml_tags);
  memset(tags_00,0,0x5a0);
  return;
}

Assistant:

void TY_(FreeTags)( TidyDocImpl* doc )
{
    TidyTagImpl* tags = &doc->tags;

#if ELEMENT_HASH_LOOKUP
    tagsEmptyHash( doc, tags );
#endif
    TY_(FreeDeclaredTags)( doc, tagtype_null );
    FreeDict( doc, tags->xml_tags );

    /* get rid of dangling tag references */
    TidyClearMemory( tags, sizeof(TidyTagImpl) );
}